

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O2

ze_result_t driver::zetMetricDecoderDestroyExp(zet_metric_decoder_exp_handle_t phMetricDecoder)

{
  ze_result_t zVar1;
  
  if (DAT_0010d7b0 != (code *)0x0) {
    zVar1 = (*DAT_0010d7b0)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricDecoderDestroyExp(
        zet_metric_decoder_exp_handle_t phMetricDecoder ///< [in] handle of the metric decoder object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExp = context.zetDdiTable.MetricDecoderExp.pfnDestroyExp;
        if( nullptr != pfnDestroyExp )
        {
            result = pfnDestroyExp( phMetricDecoder );
        }
        else
        {
            // generic implementation
        }

        return result;
    }